

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void fmt::v11::vprint(FILE *f,text_style *ts,string_view fmt,format_args args)

{
  string_view fmt_00;
  format_args args_00;
  vargs<fmt::v11::basic_string_view<char>_> va;
  memory_buffer buf;
  
  buf.super_buffer<char>.ptr_ = buf.store_;
  buf.super_buffer<char>.size_ = 0;
  buf.super_buffer<char>.grow_ =
       basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  buf.super_buffer<char>.capacity_ = 500;
  detail::vformat_to<char>(&buf.super_buffer<char>,ts,fmt,args);
  va.args[0].field_0.string.data = buf.super_buffer<char>.ptr_;
  va.args[0].field_0.string.size = buf.super_buffer<char>.size_;
  fmt_00.size_ = 2;
  fmt_00.data_ = "{}";
  args_00.field_1.values_ = va.args;
  args_00.desc_ = 0xd;
  vprint(f,fmt_00,args_00);
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::deallocate(&buf);
  return;
}

Assistant:

inline void vprint(FILE* f, const text_style& ts, string_view fmt,
                   format_args args) {
  auto buf = memory_buffer();
  detail::vformat_to(buf, ts, fmt, args);
  print(f, FMT_STRING("{}"), string_view(buf.begin(), buf.size()));
}